

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O3

bool crnlib::string_to_uint(char **pBuf,uint *value)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  
  *value = 0;
  pcVar7 = *pBuf;
  cVar2 = *pcVar7;
  while (cVar2 != '\0') {
    iVar4 = isspace((int)cVar2);
    if (iVar4 == 0) {
      uVar5 = 0;
      if ((int)cVar2 - 0x30U < 10) goto LAB_00166672;
      goto LAB_0016665d;
    }
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    cVar2 = *pcVar1;
  }
  goto LAB_0016665b;
  while( true ) {
    uVar3 = uVar5 * 10;
    pcVar7 = pcVar7 + 1;
    uVar5 = uVar3 + uVar6;
    if (CARRY4(uVar3,uVar6)) break;
LAB_00166672:
    if ((*pcVar7 == '\0') || (uVar6 = (int)*pcVar7 - 0x30, 9 < uVar6)) {
      *value = uVar5;
      *pBuf = pcVar7;
      uVar5 = 1;
      goto LAB_0016665d;
    }
    if ((0x1fffffff < uVar5) || (CARRY4(uVar5 * 8,uVar5 * 2))) break;
  }
LAB_0016665b:
  uVar5 = 0;
LAB_0016665d:
  return SUB41(uVar5,0);
}

Assistant:

bool string_to_uint(const char*& pBuf, uint& value) {
  value = 0;

  CRNLIB_ASSERT(pBuf);
  const char* p = pBuf;

  while (*p && isspace(*p))
    p++;

  uint result = 0;

  if (!isdigit(*p))
    return false;

  while (*p && isdigit(*p)) {
    if (result & 0xE0000000U)
      return false;

    const uint result8 = result << 3U;
    const uint result2 = result << 1U;

    if (result2 > (0xFFFFFFFFU - result8))
      return false;

    result = result8 + result2;

    uint c = p[0] - '0';
    if (c > (0xFFFFFFFFU - result))
      return false;

    result += c;

    p++;
  }

  value = result;

  pBuf = p;

  return true;
}